

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  sigaction *__act;
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  TestRole TVar5;
  UnitTestImpl *pUVar6;
  int *piVar7;
  void *__addr;
  undefined8 extraout_RAX;
  long lVar8;
  size_t __len;
  undefined1 local_310 [8];
  string filter_flag;
  string internal_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  undefined1 local_1a0 [8];
  ExecDeathTestArgs args_2;
  string local_180;
  undefined1 local_160 [8];
  Arguments args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  int local_11c;
  int local_118;
  int death_test_index;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  bool result;
  allocator<char> local_29;
  
  pUVar6 = GetUnitTestImpl();
  pTVar1 = pUVar6->current_test_info_;
  pIVar2 = (pUVar6->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_11c = (pTVar1->result_).death_test_count_;
  if (pIVar2 == (InternalRunDeathTestFlag *)0x0) {
    iVar3 = pipe(&local_118);
    if (iVar3 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"CHECK failed: File ",(allocator<char> *)pipe_fd);
      std::operator+(&local_b0,&local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_b0,", line ");
      local_f0._M_dataplus._M_p._0_4_ = 0x589;
      StreamableToString<int>(&local_d0,(int *)&local_f0);
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&internal_flag.field_2 + 8),&local_70,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action.sa_restorer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&internal_flag.field_2 + 8),"pipe(pipe_fd) != -1");
      DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
    }
    else {
      iVar3 = fcntl(death_test_index,2,0);
      if (iVar3 != -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"--",(allocator<char> *)&local_d0);
        std::operator+(&local_b0,&local_90,"gtest_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_b0,"filter");
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"=");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8),&local_70,
                       (pTVar1->test_suite_name_)._M_dataplus._M_p);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action.sa_restorer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8),".");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action.sa_restorer,(pTVar1->name_)._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action.sa_restorer);
        std::__cxx11::string::~string((string *)(internal_flag.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"--",&local_29);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       &local_140,"gtest_");
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       "internal_run_death_test");
        std::operator+(&local_d0,&local_f0,"=");
        std::operator+(&local_90,&local_d0,this->file_);
        std::operator+(&local_b0,&local_90,"|");
        StreamableToString<int>((string *)local_160,&this->line_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160);
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"|");
        StreamableToString<int>((string *)local_1a0,&local_11c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8),&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action.sa_restorer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8),"|");
        StreamableToString<int>(&local_180,&death_test_index);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&filter_flag.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action.sa_restorer,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action.sa_restorer);
        std::__cxx11::string::~string((string *)(internal_flag.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1a0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)pipe_fd);
        std::__cxx11::string::~string((string *)&local_140);
        Arguments::Arguments((Arguments *)local_160);
        GetInjectableArgvs_abi_cxx11_();
        Arguments::AddArguments<std::__cxx11::string>
                  ((Arguments *)local_160,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ignore_sigprof_action.sa_restorer);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ignore_sigprof_action.sa_restorer);
        Arguments::AddArgument((Arguments *)local_160,(char *)local_310);
        Arguments::AddArgument((Arguments *)local_160,(char *)filter_flag.field_2._8_8_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ignore_sigprof_action.sa_restorer,"",
                   (allocator<char> *)(internal_flag.field_2._M_local_buf + 8));
        DeathTest::set_last_death_test_message((string *)&ignore_sigprof_action.sa_restorer);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action.sa_restorer);
        CaptureStderr();
        FlushInfoLog();
        local_1a0 = local_160;
        args_2.argv._0_4_ = local_118;
        __act = (sigaction *)((long)&internal_flag.field_2 + 8);
        memset(__act,0,0x98);
        sigemptyset((sigset_t *)&ignore_sigprof_action);
        internal_flag.field_2._8_8_ = 1;
        do {
          iVar3 = sigaction(0x1b,__act,(sigaction *)&ignore_sigprof_action.sa_restorer);
          if (iVar3 != -1) goto LAB_0011b633;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pipe_fd,"CHECK failed: File ",&local_29);
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_d0,&local_f0,", line ");
        local_180._M_dataplus._M_p._0_4_ = 0x546;
        StreamableToString<int>(&local_140,(int *)&local_180);
        std::operator+(&local_90,&local_d0,&local_140);
        std::operator+(&local_b0,&local_90,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_b0,
                       "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ," != -1");
        DeathTestAbort(&local_70);
LAB_0011b633:
        if (FLAGS_gtest_death_test_use_fork != '\0') {
          iVar3 = fork();
          if (iVar3 == 0) goto LAB_0011bb3c;
          goto LAB_0011b6e8;
        }
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_0011bb48;
        goto LAB_0011b662;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CHECK failed: File ",(allocator<char> *)pipe_fd);
    std::operator+(&local_b0,&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_b0,", line ");
    local_f0._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&internal_flag.field_2 + 8),&local_70,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action.sa_restorer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&internal_flag.field_2 + 8),"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"CHECK failed: File ",(allocator<char> *)&local_180);
      std::operator+(&local_d0,&local_f0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_90,&local_d0,", line ");
      local_140._M_dataplus._M_p._0_4_ = 0x574;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_140);
      std::operator+(&local_b0,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_b0,": ");
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "child_pid != -1");
      DeathTestAbort(&local_70);
LAB_0011bb3c:
      ExecDeathTestChildMain(local_1a0);
LAB_0011bb48:
      iVar3 = __cxa_guard_acquire();
      if (iVar3 != 0) {
        StackLowerThanAddress(&local_70,(bool *)local_50);
        ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = local_50[0];
        __cxa_guard_release();
      }
LAB_0011b662:
      iVar3 = getpagesize();
      __len = (size_t)(iVar3 * 2);
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"CHECK failed: File ",(allocator<char> *)&local_180);
        std::operator+(&local_d0,&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_90,&local_d0,", line ");
        local_140._M_dataplus._M_p._0_4_ = 0x552;
        StreamableToString<int>((string *)pipe_fd,(int *)&local_140);
        std::operator+(&local_b0,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_b0,": ");
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"stack != MAP_FAILED");
        DeathTestAbort(&local_70);
LAB_0011bc3b:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"CHECK failed: File ",(allocator<char> *)&local_180);
        std::operator+(&local_d0,&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_90,&local_d0,", line ");
        local_140._M_dataplus._M_p._0_4_ = 0x560;
        StreamableToString<int>((string *)pipe_fd,(int *)&local_140);
        std::operator+(&local_b0,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_b0,": ");
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,
                       "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                      );
        DeathTestAbort(&local_70);
LAB_0011bcf0:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"CHECK failed: File ",(allocator<char> *)&local_180);
        std::operator+(&local_d0,&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_90,&local_d0,", line ");
        local_140._M_dataplus._M_p._0_4_ = 0x564;
        StreamableToString<int>((string *)pipe_fd,(int *)&local_140);
        std::operator+(&local_b0,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_b0,": ");
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"munmap(stack, stack_size) != -1");
        DeathTestAbort(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)pipe_fd);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        Arguments::~Arguments((Arguments *)local_160);
        std::__cxx11::string::~string((string *)(filter_flag.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_310);
        _Unwind_Resume(extraout_RAX);
      }
      lVar8 = 0;
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != (string)0x0) {
        lVar8 = __len - 0x40;
      }
      if (((uint)(iVar3 * 2) < 0x41) || (((ulong)(lVar8 + (long)__addr) & 0x3f) != 0))
      goto LAB_0011bc3b;
      iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar8 + (long)__addr),0x11,local_1a0);
      iVar4 = munmap(__addr,__len);
      if (iVar4 == -1) goto LAB_0011bcf0;
LAB_0011b6e8:
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action.sa_restorer,(sigaction *)0x0);
        if (iVar4 != -1) goto LAB_0011b7df;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pipe_fd,"CHECK failed: File ",&local_29);
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_d0,&local_f0,", line ");
      local_180._M_dataplus._M_p._0_4_ = 0x571;
      StreamableToString<int>(&local_140,(int *)&local_180);
      std::operator+(&local_90,&local_d0,&local_140);
      std::operator+(&local_b0,&local_90,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_b0,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     " != -1");
      DeathTestAbort(&local_70);
LAB_0011b7df:
    } while (iVar3 == -1);
    do {
      iVar4 = close(death_test_index);
      if (iVar4 != -1) goto LAB_0011b8d6;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CHECK failed: File ",(allocator<char> *)&local_140);
    std::operator+(&local_90,&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/fn-code[P]projectone/third_party/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_b0,&local_90,", line ");
    pipe_fd[0] = 0x5a3;
    StreamableToString<int>(&local_f0,pipe_fd);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_b0,&local_f0);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&internal_flag.field_2 + 8),&local_70,"close(pipe_fd[1])");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action.sa_restorer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&internal_flag.field_2 + 8)," != -1");
    DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
LAB_0011b8d6:
    *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_118;
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    Arguments::~Arguments((Arguments *)local_160);
    std::__cxx11::string::~string((string *)(filter_flag.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_310);
    TVar5 = OVERSEE_TEST;
  }
  else {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    TVar5 = EXECUTE_TEST;
  }
  return TVar5;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}